

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

lu_mem entergen(lua_State *L,global_State *g)

{
  lu_mem lVar1;
  
  luaC_runtilstate(L,0x100);
  luaC_runtilstate(L,1);
  lVar1 = atomic(L);
  atomic2gen(L,g);
  luaE_setdebt(g,-((ulong)g->genminormul * ((ulong)(g->GCdebt + g->totalbytes) / 100)));
  return lVar1;
}

Assistant:

static lu_mem entergen (lua_State *L, global_State *g) {
  lu_mem numobjs;
  luaC_runtilstate(L, bitmask(GCSpause));  /* prepare to start a new cycle */
  luaC_runtilstate(L, bitmask(GCSpropagate));  /* start new cycle */
  numobjs = atomic(L);  /* propagates all and then do the atomic stuff */
  atomic2gen(L, g);
  setminordebt(g);  /* set debt assuming next cycle will be minor */
  return numobjs;
}